

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::js::Generator::GenerateAll
          (Generator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *context,string *error)

{
  FileDescriptor *pFVar1;
  pointer ppFVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  LogMessage *pLVar6;
  undefined4 extraout_var_00;
  pointer ppFVar7;
  ulong uVar8;
  size_type sVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  string *file;
  GeneratorOptions *pGVar10;
  Printer *printer_00;
  Printer *printer_01;
  Printer *extraout_RDX;
  Printer *extraout_RDX_00;
  Printer *extraout_RDX_01;
  Printer *printer_02;
  int i;
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  _Var11;
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  __first;
  Generator *pGVar12;
  Printer *pPVar13;
  FieldDescriptor *pFVar14;
  byte bVar15;
  int i_1;
  long lVar16;
  long lVar17;
  GeneratorOptions *pGVar18;
  GeneratorOptions *pGVar19;
  int j_1;
  ulong uVar20;
  long local_240;
  string filename;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  files_ordered;
  _Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet> local_1d8;
  Printer printer;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_> allowed_set;
  GeneratorOptions options;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  option_pairs;
  ZeroCopyOutputStream *pZVar5;
  
  option_pairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  option_pairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  option_pairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&option_pairs);
  GeneratorOptions::GeneratorOptions(&options);
  bVar3 = GeneratorOptions::ParseFromOptions(&options,&option_pairs,error);
  if (bVar3) {
    if (options.import_style == kImportClosure) {
      if (options.library._M_string_length == 0 || options.one_output_file_per_input_file != false)
      {
        if ((options.one_output_file_per_input_file | options.library._M_string_length != 0) == 1)
        goto LAB_0025a3e5;
        allowed_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &allowed_set._M_t._M_impl.super__Rb_tree_header._M_header;
        allowed_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        allowed_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        allowed_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        files_ordered.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        files_ordered.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        files_ordered.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        printer._24_8_ = &printer.output_;
        printer.output_._0_4_ = 0;
        printer.buffer_ = (char *)0x0;
        printer.indent_._M_dataplus._M_p = (pointer)0x0;
        filename.field_2._8_8_ = &filename._M_string_length;
        filename._M_string_length._0_4_ = 0;
        filename.field_2._M_allocated_capacity = 0;
        lVar16 = 0;
        printer.offset_ = printer._24_8_;
        allowed_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             allowed_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (uVar20 = 0;
            ppFVar2 = files_ordered.
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            ppFVar7 = (files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_start,
            uVar20 < (ulong)((long)(files->
                                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3)
            ; uVar20 = uVar20 + 1) {
          anon_unknown_0::DepthFirstSearch
                    (*(FileDescriptor **)((long)ppFVar7 + lVar16),&files_ordered,
                     (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *)&printer);
          std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                    ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)&filename,
                     (FileDescriptor **)
                     ((long)(files->
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar16));
          lVar16 = lVar16 + 8;
        }
        lVar16 = (long)files_ordered.
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)files_ordered.
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        _Var11._M_current =
             files_ordered.
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1d8._M_pred.file_set_ = (NotInSet)(NotInSet)&filename;
        fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&filename;
        for (lVar17 = lVar16 >> 5; 0 < lVar17; lVar17 = lVar17 + -1) {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>::
                  operator()((_Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>
                              *)&fields,_Var11);
          __first._M_current = _Var11._M_current;
          if (bVar3) goto LAB_0025a9a8;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>::
                  operator()((_Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>
                              *)&fields,
                             (__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                              )(_Var11._M_current + 1));
          __first._M_current = _Var11._M_current + 1;
          if (bVar3) goto LAB_0025a9a8;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>::
                  operator()((_Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>
                              *)&fields,
                             (__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                              )(_Var11._M_current + 2));
          __first._M_current = _Var11._M_current + 2;
          if (bVar3) goto LAB_0025a9a8;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>::
                  operator()((_Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>
                              *)&fields,
                             (__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                              )(_Var11._M_current + 3));
          __first._M_current = _Var11._M_current + 3;
          if (bVar3) goto LAB_0025a9a8;
          _Var11._M_current = _Var11._M_current + 4;
          lVar16 = lVar16 + -0x20;
        }
        lVar16 = lVar16 >> 3;
        if (lVar16 == 1) {
LAB_0025abe0:
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>::
                  operator()((_Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>
                              *)&fields,_Var11);
          __first._M_current = _Var11._M_current;
          if (!bVar3) {
            __first._M_current = ppFVar2;
          }
LAB_0025a9a8:
          if (__first._M_current != ppFVar2) {
            _Var11._M_current = __first._M_current;
            while (_Var11._M_current = _Var11._M_current + 1, _Var11._M_current != ppFVar2) {
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>::
                      operator()(&local_1d8,_Var11);
              if (!bVar3) {
                *__first._M_current = *_Var11._M_current;
                __first._M_current = __first._M_current + 1;
              }
            }
          }
        }
        else {
          if (lVar16 == 2) {
LAB_0025abc2:
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>::
                    operator()((_Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>
                                *)&fields,_Var11);
            __first._M_current = _Var11._M_current;
            if (!bVar3) {
              _Var11._M_current = _Var11._M_current + 1;
              goto LAB_0025abe0;
            }
            goto LAB_0025a9a8;
          }
          __first._M_current = ppFVar2;
          if (lVar16 == 3) {
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>::
                    operator()((_Iter_pred<google::protobuf::compiler::js::(anonymous_namespace)::NotInSet>
                                *)&fields,_Var11);
            __first._M_current = _Var11._M_current;
            if (!bVar3) {
              _Var11._M_current = _Var11._M_current + 1;
              goto LAB_0025abc2;
            }
            goto LAB_0025a9a8;
          }
        }
        std::
        vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::erase(&files_ordered,(const_iterator)__first._M_current,
                (const_iterator)
                files_ordered.
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish);
        std::
        _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)&filename);
        std::
        _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)&printer);
        printer.variable_delimiter_ = options.error_on_name_conflict;
        printer.offset_ = (size_t)&printer.buffer_;
        printer.buffer_ = (char *)((ulong)printer.buffer_ & 0xffffffff00000000);
        printer.buffer_size_ = 0;
        printer._28_4_ = 0;
        printer.indent_._M_string_length = 0;
        printer.substitutions_._M_t._M_impl._0_8_ =
             &printer.indent_.field_2._M_allocated_capacity + 1;
        printer.indent_.field_2._8_4_ = 0;
        printer.at_start_of_line_ = false;
        printer.failed_ = false;
        printer._74_6_ = 0;
        printer.substitutions_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        uVar20 = 0;
        printer.indent_._M_dataplus._M_p = (pointer)printer.offset_;
        printer.substitutions_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             printer.substitutions_._M_t._M_impl._0_8_;
        while( true ) {
          lVar16 = -1;
          uVar8 = (long)files_ordered.
                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)files_ordered.
                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          if (uVar8 <= uVar20) break;
          lVar17 = 0;
          while( true ) {
            file = (string *)
                   (long)*(int *)(files_ordered.
                                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar20] + 0x58);
            lVar16 = lVar16 + 1;
            if ((long)file <= lVar16) break;
            pGVar18 = (GeneratorOptions *)
                      (*(long *)(files_ordered.
                                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar20] + 0x60) + lVar17)
            ;
            (anonymous_namespace)::GetMessageFileName_abi_cxx11_
                      (&filename,(_anonymous_namespace_ *)&options,pGVar18,(Descriptor *)file);
            bVar3 = anon_unknown_0::FileDeduplicator::AddFile
                              ((FileDeduplicator *)&printer,&filename,pGVar18,error);
            lVar17 = lVar17 + 0xa8;
            std::__cxx11::string::~string((string *)&filename);
            if (!bVar3) goto LAB_0025ac1c;
          }
          lVar16 = -1;
          lVar17 = 0;
          while( true ) {
            pGVar18 = (GeneratorOptions *)
                      files_ordered.
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20];
            lVar16 = lVar16 + 1;
            if (*(int *)((long)&(pGVar18->library).field_2 + 8) <= lVar16) break;
            pGVar18 = (GeneratorOptions *)(*(long *)&pGVar18->error_on_name_conflict + lVar17);
            (anonymous_namespace)::GetEnumFileName_abi_cxx11_
                      (&filename,(_anonymous_namespace_ *)&options,pGVar18,(EnumDescriptor *)file);
            file = error;
            bVar3 = anon_unknown_0::FileDeduplicator::AddFile
                              ((FileDeduplicator *)&printer,&filename,pGVar18,error);
            lVar17 = lVar17 + 0x38;
            std::__cxx11::string::~string((string *)&filename);
            if (!bVar3) goto LAB_0025ac1c;
          }
          lVar17 = 0;
          bVar15 = 0;
          for (lVar16 = 0; lVar16 < *(int *)&(pGVar18->extension).field_2; lVar16 = lVar16 + 1) {
            bVar3 = anon_unknown_0::ShouldGenerateExtension
                              ((FieldDescriptor *)
                               (*(long *)&pGVar18->one_output_file_per_input_file + lVar17));
            bVar15 = bVar15 | bVar3;
            pGVar18 = (GeneratorOptions *)
                      files_ordered.
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20];
            lVar17 = lVar17 + 0xa8;
          }
          if (bVar15 != 0) {
            (anonymous_namespace)::GetExtensionFileName_abi_cxx11_
                      (&filename,(_anonymous_namespace_ *)&options,pGVar18,(FileDescriptor *)file);
            bVar3 = anon_unknown_0::FileDeduplicator::AddFile
                              ((FileDeduplicator *)&printer,&filename,
                               files_ordered.
                               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar20],error);
            std::__cxx11::string::~string((string *)&filename);
            if (!bVar3) goto LAB_0025ac1c;
          }
          uVar20 = uVar20 + 1;
        }
        std::
        _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
        ::operator=(&allowed_set._M_t,
                    (_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                     *)&printer.indent_.field_2);
LAB_0025ac1c:
        anon_unknown_0::FileDeduplicator::~FileDeduplicator((FileDeduplicator *)&printer);
        std::
        _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::~_Vector_base(&files_ordered.
                         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       );
        if (uVar20 < uVar8) {
LAB_0025ac36:
          std::
          _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
          ::~_Rb_tree(&allowed_set._M_t);
          goto LAB_0025ac43;
        }
        for (uVar20 = 0;
            ppFVar7 = (files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_start,
            uVar20 < (ulong)((long)(files->
                                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3)
            ; uVar20 = uVar20 + 1) {
          pGVar18 = (GeneratorOptions *)ppFVar7[uVar20];
          local_240 = 0;
          for (lVar16 = 0; lVar16 < (int)(pGVar18->library)._M_string_length; lVar16 = lVar16 + 1) {
            pGVar19 = (GeneratorOptions *)
                      ((pGVar18->library).field_2._M_allocated_capacity + local_240);
            pGVar10 = pGVar18;
            printer._0_8_ = pGVar19;
            sVar9 = std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>::
                    count(&allowed_set,(key_type *)&printer);
            if (sVar9 != 0) {
              (anonymous_namespace)::GetMessageFileName_abi_cxx11_
                        ((string *)&files_ordered,(_anonymous_namespace_ *)&options,pGVar19,
                         (Descriptor *)pGVar10);
              iVar4 = (*context->_vptr_GeneratorContext[2])(context,(string *)&files_ordered);
              pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar4);
              if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)&printer,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                           ,0xd62);
                pLVar6 = internal::LogMessage::operator<<
                                   ((LogMessage *)&printer,"CHECK failed: output.get(): ");
                internal::LogFinisher::operator=((LogFinisher *)&filename,pLVar6);
                internal::LogMessage::~LogMessage((LogMessage *)&printer);
              }
              io::Printer::Printer(&printer,pZVar5,'$');
              io::Printer::Print(&printer,
                                 "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                                );
              filename._M_string_length._0_4_ = 0;
              filename.field_2._M_allocated_capacity = 0;
              filename.field_2._8_8_ = &filename._M_string_length;
              pGVar12 = this;
              FindProvidesForMessage
                        (this,&options,&printer,(Descriptor *)pGVar19,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&filename);
              GenerateProvides(pGVar12,&options,&printer,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&filename);
              GenerateTestOnly(pGVar12,&options,&printer);
              GenerateRequiresForMessage
                        (this,&options,&printer,(Descriptor *)pGVar19,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&filename);
              GenerateClass(this,&options,&printer,(Descriptor *)pGVar19);
              bVar3 = printer.failed_;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filename);
              io::Printer::~Printer(&printer);
              if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
                (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
              }
              std::__cxx11::string::~string((string *)&files_ordered);
              if (bVar3 != false) goto LAB_0025ac36;
            }
            local_240 = local_240 + 0xa8;
          }
          local_240 = 0;
          for (lVar16 = 0; lVar16 < *(int *)((long)&(pGVar18->library).field_2 + 8);
              lVar16 = lVar16 + 1) {
            pGVar19 = (GeneratorOptions *)(*(long *)&pGVar18->error_on_name_conflict + local_240);
            pGVar10 = pGVar18;
            printer._0_8_ = pGVar19;
            sVar9 = std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>::
                    count(&allowed_set,(key_type *)&printer);
            if (sVar9 != 0) {
              (anonymous_namespace)::GetEnumFileName_abi_cxx11_
                        ((string *)&files_ordered,(_anonymous_namespace_ *)&options,pGVar19,
                         (EnumDescriptor *)pGVar10);
              iVar4 = (*context->_vptr_GeneratorContext[2])(context,(string *)&files_ordered);
              pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar4);
              if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)&printer,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                           ,0xd7c);
                pLVar6 = internal::LogMessage::operator<<
                                   ((LogMessage *)&printer,"CHECK failed: output.get(): ");
                internal::LogFinisher::operator=((LogFinisher *)&filename,pLVar6);
                internal::LogMessage::~LogMessage((LogMessage *)&printer);
              }
              pPVar13 = &printer;
              io::Printer::Printer(pPVar13,pZVar5,'$');
              io::Printer::Print(pPVar13,
                                 "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                                );
              filename._M_string_length._0_4_ = 0;
              filename.field_2._M_allocated_capacity = 0;
              filename.field_2._8_8_ = &filename._M_string_length;
              FindProvidesForEnum((Generator *)pPVar13,&options,printer_01,(EnumDescriptor *)pGVar19
                                  ,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&filename);
              GenerateProvides((Generator *)pPVar13,&options,&printer,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&filename);
              GenerateTestOnly((Generator *)pPVar13,&options,&printer);
              GenerateEnum((Generator *)pPVar13,&options,&printer,(EnumDescriptor *)pGVar19);
              bVar3 = printer.failed_;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&filename);
              io::Printer::~Printer(&printer);
              if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
                (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
              }
              std::__cxx11::string::~string((string *)&files_ordered);
              if (bVar3 != false) goto LAB_0025ac36;
            }
            local_240 = local_240 + 0x38;
          }
          pGVar10 = pGVar18;
          printer._0_8_ = pGVar18;
          sVar9 = std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>::
                  count(&allowed_set,(key_type *)&printer);
          if (sVar9 == 1) {
            (anonymous_namespace)::GetExtensionFileName_abi_cxx11_
                      ((string *)&files_ordered,(_anonymous_namespace_ *)&options,pGVar18,
                       (FileDescriptor *)pGVar10);
            iVar4 = (*context->_vptr_GeneratorContext[2])(context,(string *)&files_ordered);
            pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar4);
            if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)&printer,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                         ,0xd93);
              pLVar6 = internal::LogMessage::operator<<
                                 ((LogMessage *)&printer,"CHECK failed: output.get(): ");
              internal::LogFinisher::operator=((LogFinisher *)&filename,pLVar6);
              internal::LogMessage::~LogMessage((LogMessage *)&printer);
            }
            pPVar13 = &printer;
            io::Printer::Printer(pPVar13,pZVar5,'$');
            io::Printer::Print(pPVar13,
                               "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                              );
            filename._M_string_length._0_4_ = 0;
            filename.field_2._M_allocated_capacity = 0;
            filename.field_2._8_8_ = &filename._M_string_length;
            fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            lVar16 = 0;
            printer_02 = extraout_RDX;
            for (lVar17 = 0;
                pFVar1 = (files->
                         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar20],
                lVar17 < *(int *)(pFVar1 + 0x88); lVar17 = lVar17 + 1) {
              pPVar13 = (Printer *)(*(long *)(pFVar1 + 0x98) + lVar16);
              bVar3 = anon_unknown_0::ShouldGenerateExtension((FieldDescriptor *)pPVar13);
              printer_02 = extraout_RDX_00;
              if (bVar3) {
                local_1d8._M_pred.file_set_ =
                     (NotInSet)
                     (*(long *)((files->
                                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar20] + 0x98) + lVar16)
                ;
                pPVar13 = (Printer *)&fields;
                std::
                vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                ::emplace_back<google::protobuf::FieldDescriptor_const*>
                          ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                            *)pPVar13,(FieldDescriptor **)&local_1d8);
                printer_02 = extraout_RDX_01;
              }
              lVar16 = lVar16 + 0xa8;
            }
            FindProvidesForFields
                      ((Generator *)pPVar13,&options,printer_02,&fields,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&filename);
            GenerateProvides((Generator *)pPVar13,&options,&printer,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&filename);
            GenerateTestOnly((Generator *)pPVar13,&options,&printer);
            GenerateRequiresForExtensions
                      (this,&options,&printer,&fields,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&filename);
            lVar16 = 0;
            for (lVar17 = 0;
                pFVar1 = (files->
                         super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar20],
                lVar17 < *(int *)(pFVar1 + 0x88); lVar17 = lVar17 + 1) {
              pFVar14 = (FieldDescriptor *)(*(long *)(pFVar1 + 0x98) + lVar16);
              bVar3 = anon_unknown_0::ShouldGenerateExtension(pFVar14);
              if (bVar3) {
                GenerateExtension((Generator *)pFVar14,&options,&printer,
                                  (FieldDescriptor *)
                                  (*(long *)((files->
                                             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar20] +
                                            0x98) + lVar16));
              }
              lVar16 = lVar16 + 0xa8;
            }
            std::
            _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::~_Vector_base(&fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&filename);
            io::Printer::~Printer(&printer);
            if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
            }
            std::__cxx11::string::~string((string *)&files_ordered);
          }
        }
        std::
        _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
        ::~_Rb_tree(&allowed_set._M_t);
      }
      else {
        std::operator+(&filename,&options.output_dir,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                       ,&filename,&options.library);
        GeneratorOptions::GetFileNameExtension_abi_cxx11_((string *)&files_ordered,&options);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &allowed_set,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &files_ordered);
        std::__cxx11::string::~string((string *)&files_ordered);
        std::__cxx11::string::~string((string *)&printer);
        std::__cxx11::string::~string((string *)&filename);
        iVar4 = (*context->_vptr_GeneratorContext[2])(context,&allowed_set);
        pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
        if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&printer,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                     ,0xd30);
          pLVar6 = internal::LogMessage::operator<<
                             ((LogMessage *)&printer,"CHECK failed: output.get(): ");
          internal::LogFinisher::operator=((LogFinisher *)&filename,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)&printer);
        }
        io::Printer::Printer(&printer,pZVar5,'$');
        files_ordered.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        files_ordered.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        files_ordered.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ppFVar7 = (files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        for (uVar20 = 0;
            uVar20 < (ulong)((long)(files->
                                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3)
            ; uVar20 = uVar20 + 1) {
          lVar16 = 0;
          for (lVar17 = 0; lVar17 < *(int *)(ppFVar7[uVar20] + 0x88); lVar17 = lVar17 + 1) {
            filename._M_dataplus._M_p = (pointer)(*(long *)(ppFVar7[uVar20] + 0x98) + lVar16);
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)&files_ordered,(value_type *)&filename);
            ppFVar7 = (files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0xa8;
          }
        }
        io::Printer::Print(&printer,
                           "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                          );
        filename.field_2._8_8_ = &filename._M_string_length;
        filename._M_string_length._0_4_ = 0;
        filename.field_2._M_allocated_capacity = 0;
        pGVar12 = this;
        FindProvides(this,&options,&printer,files,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&filename);
        FindProvidesForFields
                  (pGVar12,&options,printer_00,
                   (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&files_ordered,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&filename);
        GenerateProvides(pGVar12,&options,&printer,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&filename);
        GenerateTestOnly(pGVar12,&options,&printer);
        GenerateRequiresForLibrary
                  (this,&options,&printer,files,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&filename);
        GenerateFilesInDepOrder(this,&options,&printer,files);
        for (uVar20 = 0;
            uVar20 < (ulong)((long)files_ordered.
                                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)files_ordered.
                                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar20 = uVar20 + 1) {
          pFVar14 = (FieldDescriptor *)
                    files_ordered.
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar20];
          bVar3 = anon_unknown_0::ShouldGenerateExtension(pFVar14);
          if (bVar3) {
            GenerateExtension((Generator *)pFVar14,&options,&printer,
                              (FieldDescriptor *)
                              files_ordered.
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar20]);
          }
        }
        bVar3 = printer.failed_;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&filename);
        std::
        _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)&files_ordered);
        io::Printer::~Printer(&printer);
        if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar5->_vptr_ZeroCopyOutputStream[1])();
        }
        std::__cxx11::string::~string((string *)&allowed_set);
        if (bVar3 != false) goto LAB_0025ac43;
      }
LAB_0025a8cd:
      bVar3 = true;
      goto LAB_0025ac45;
    }
LAB_0025a3e5:
    uVar20 = 0;
    do {
      ppFVar7 = (files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(files->
                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3) <= uVar20)
      goto LAB_0025a8cd;
      pFVar1 = ppFVar7[uVar20];
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     &options.output_dir,"/");
      anon_unknown_0::GetJSFilename((string *)&allowed_set,&options,*(string **)pFVar1);
      std::operator+(&filename,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     (string *)&allowed_set);
      std::__cxx11::string::~string((string *)&allowed_set);
      std::__cxx11::string::~string((string *)&printer);
      iVar4 = (*context->_vptr_GeneratorContext[2])(context,&filename);
      pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
      if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&printer,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                   ,0xdb6);
        pLVar6 = internal::LogMessage::operator<<
                           ((LogMessage *)&printer,"CHECK failed: output.get(): ");
        internal::LogFinisher::operator=((LogFinisher *)&allowed_set,pLVar6);
        internal::LogMessage::~LogMessage((LogMessage *)&printer);
      }
      io::Printer::Printer(&printer,pZVar5,'$');
      GenerateFile(this,&options,&printer,pFVar1);
      bVar3 = printer.failed_;
      io::Printer::~Printer(&printer);
      if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
      }
      std::__cxx11::string::~string((string *)&filename);
      uVar20 = uVar20 + 1;
    } while (bVar3 == false);
  }
LAB_0025ac43:
  bVar3 = false;
LAB_0025ac45:
  GeneratorOptions::~GeneratorOptions(&options);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&option_pairs);
  return bVar3;
}

Assistant:

bool Generator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                            const string& parameter,
                            GeneratorContext* context,
                            string* error) const {
  std::vector< std::pair< string, string > > option_pairs;
  ParseGeneratorParameter(parameter, &option_pairs);
  GeneratorOptions options;
  if (!options.ParseFromOptions(option_pairs, error)) {
    return false;
  }


  if (options.output_mode() == GeneratorOptions::kEverythingInOneFile) {
    // All output should go in a single file.
    string filename = options.output_dir + "/" + options.library +
                      options.GetFileNameExtension();
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GOOGLE_CHECK(output.get());
    io::Printer printer(output.get(), '$');

    // Pull out all extensions -- we need these to generate all
    // provides/requires.
    std::vector<const FieldDescriptor*> extensions;
    for (int i = 0; i < files.size(); i++) {
      for (int j = 0; j < files[i]->extension_count(); j++) {
        const FieldDescriptor* extension = files[i]->extension(j);
        extensions.push_back(extension);
      }
    }

    GenerateHeader(options, &printer);

    std::set<string> provided;
    FindProvides(options, &printer, files, &provided);
    FindProvidesForFields(options, &printer, extensions, &provided);
    GenerateProvides(options, &printer, &provided);
    GenerateTestOnly(options, &printer);
    GenerateRequiresForLibrary(options, &printer, files, &provided);

    GenerateFilesInDepOrder(options, &printer, files);

    for (int i = 0; i < extensions.size(); i++) {
      if (ShouldGenerateExtension(extensions[i])) {
        GenerateExtension(options, &printer, extensions[i]);
      }
    }

    if (printer.failed()) {
      return false;
    }
  } else if (options.output_mode() == GeneratorOptions::kOneOutputFilePerType) {
    std::set<const void*> allowed_set;
    if (!GenerateJspbAllowedSet(options, files, &allowed_set, error)) {
      return false;
    }

    for (int i = 0; i < files.size(); i++) {
      const FileDescriptor* file = files[i];
      for (int j = 0; j < file->message_type_count(); j++) {
        const Descriptor* desc = file->message_type(j);
        if (allowed_set.count(desc) == 0) {
          continue;
        }

        string filename = GetMessageFileName(options, desc);
        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        FindProvidesForMessage(options, &printer, desc, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);
        GenerateRequiresForMessage(options, &printer, desc, &provided);

        GenerateClass(options, &printer, desc);

        if (printer.failed()) {
          return false;
        }
      }
      for (int j = 0; j < file->enum_type_count(); j++) {
        const EnumDescriptor* enumdesc = file->enum_type(j);
        if (allowed_set.count(enumdesc) == 0) {
          continue;
        }

        string filename = GetEnumFileName(options, enumdesc);
        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        FindProvidesForEnum(options, &printer, enumdesc, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);

        GenerateEnum(options, &printer, enumdesc);

        if (printer.failed()) {
          return false;
        }
      }
      // File-level extensions (message-level extensions are generated under
      // the enclosing message).
      if (allowed_set.count(file) == 1) {
        string filename = GetExtensionFileName(options, file);

        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        std::vector<const FieldDescriptor*> fields;

        for (int j = 0; j < files[i]->extension_count(); j++) {
          if (ShouldGenerateExtension(files[i]->extension(j))) {
            fields.push_back(files[i]->extension(j));
          }
        }

        FindProvidesForFields(options, &printer, fields, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);
        GenerateRequiresForExtensions(options, &printer, fields, &provided);

        for (int j = 0; j < files[i]->extension_count(); j++) {
          if (ShouldGenerateExtension(files[i]->extension(j))) {
            GenerateExtension(options, &printer, files[i]->extension(j));
          }
        }
      }
    }
  } else /* options.output_mode() == kOneOutputFilePerInputFile */ {
    // Generate one output file per input (.proto) file.

    for (int i = 0; i < files.size(); i++) {
      const google::protobuf::FileDescriptor* file = files[i];

      string filename =
          options.output_dir + "/" + GetJSFilename(options, file->name());
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
      GOOGLE_CHECK(output.get());
      io::Printer printer(output.get(), '$');

      GenerateFile(options, &printer, file);

      if (printer.failed()) {
        return false;
      }
    }
  }

  return true;
}